

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool soul::AST::isResolvedAsConstant(Expression *e)

{
  int iVar1;
  long in_RAX;
  bool bVar2;
  long local_18;
  
  if (e->kind != value) {
    return false;
  }
  local_18 = in_RAX;
  iVar1 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[3])();
  if ((char)iVar1 == '\0') {
    bVar2 = false;
  }
  else {
    (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_18,e);
    bVar2 = local_18 != 0;
  }
  return bVar2;
}

Assistant:

static bool isResolvedAsConstant (Expression& e)             { return isResolvedAsValue (e) && e.getAsConstant() != nullptr; }